

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareNormStrings(xmlChar *x,xmlChar *y)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte *pbStack_20;
  int tmp;
  xmlChar *y_local;
  xmlChar *x_local;
  
  y_local = x;
  while( true ) {
    bVar3 = true;
    if ((*y_local != ' ') && ((*y_local < 9 || (bVar3 = true, 10 < *y_local)))) {
      bVar3 = *y_local == '\r';
    }
    pbStack_20 = y;
    if (!bVar3) break;
    y_local = y_local + 1;
  }
  while( true ) {
    bVar3 = true;
    if ((*pbStack_20 != 0x20) && ((*pbStack_20 < 9 || (bVar3 = true, 10 < *pbStack_20)))) {
      bVar3 = *pbStack_20 == 0xd;
    }
    if (!bVar3) break;
    pbStack_20 = pbStack_20 + 1;
  }
  do {
    while( true ) {
      bVar3 = false;
      if (*y_local != '\0') {
        bVar3 = *pbStack_20 != 0;
      }
      if (!bVar3) {
        if (*y_local != '\0') {
          while( true ) {
            bVar3 = true;
            if ((*y_local != ' ') && ((*y_local < 9 || (bVar3 = true, 10 < *y_local)))) {
              bVar3 = *y_local == '\r';
            }
            if (!bVar3) break;
            y_local = y_local + 1;
          }
          if (*y_local != '\0') {
            return 1;
          }
        }
        if (*pbStack_20 != 0) {
          while( true ) {
            bVar3 = true;
            if ((*pbStack_20 != 0x20) && ((*pbStack_20 < 9 || (bVar3 = true, 10 < *pbStack_20)))) {
              bVar3 = *pbStack_20 == 0xd;
            }
            if (!bVar3) break;
            pbStack_20 = pbStack_20 + 1;
          }
          if (*pbStack_20 != 0) {
            return -1;
          }
        }
        return 0;
      }
      if ((*y_local != ' ') && (((*y_local < 9 || (10 < *y_local)) && (*y_local != '\r')))) break;
      if ((*pbStack_20 != 0x20) &&
         (((*pbStack_20 < 9 || (10 < *pbStack_20)) && (*pbStack_20 != 0xd)))) {
        return (uint)*y_local - (uint)*pbStack_20;
      }
      while( true ) {
        bVar3 = true;
        if ((*y_local != ' ') && ((*y_local < 9 || (bVar3 = true, 10 < *y_local)))) {
          bVar3 = *y_local == '\r';
        }
        if (!bVar3) break;
        y_local = y_local + 1;
      }
      while( true ) {
        bVar3 = true;
        if ((*pbStack_20 != 0x20) && ((*pbStack_20 < 9 || (bVar3 = true, 10 < *pbStack_20)))) {
          bVar3 = *pbStack_20 == 0xd;
        }
        if (!bVar3) break;
        pbStack_20 = pbStack_20 + 1;
      }
    }
    bVar1 = *y_local;
    bVar2 = *pbStack_20;
    if ((int)((uint)bVar1 - (uint)bVar2) < 0) {
      return -1;
    }
    pbStack_20 = pbStack_20 + 1;
    y_local = y_local + 1;
  } while ((int)((uint)bVar1 - (uint)bVar2) < 1);
  return 1;
}

Assistant:

static int
xmlSchemaCompareNormStrings(const xmlChar *x,
			    const xmlChar *y) {
    int tmp;

    while (IS_BLANK_CH(*x)) x++;
    while (IS_BLANK_CH(*y)) y++;
    while ((*x != 0) && (*y != 0)) {
	if (IS_BLANK_CH(*x)) {
	    if (!IS_BLANK_CH(*y)) {
		tmp = *x - *y;
		return(tmp);
	    }
	    while (IS_BLANK_CH(*x)) x++;
	    while (IS_BLANK_CH(*y)) y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	while (IS_BLANK_CH(*x)) x++;
	if (*x != 0)
	    return(1);
    }
    if (*y != 0) {
	while (IS_BLANK_CH(*y)) y++;
	if (*y != 0)
	    return(-1);
    }
    return(0);
}